

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase490::run(TestCase490 *this)

{
  int iVar1;
  size_t sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar10;
  ArrayPtr<const_char> AVar11;
  Reader value;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  ReaderOptions options;
  ArrayPtr<capnp::word> scratchSpace;
  String huge;
  DebugComparison<capnp::Text::Reader,_kj::String_&> local_2348;
  TestPipe pipe;
  StructReader local_22d8;
  Reader local_22a8;
  PointerReader local_2288;
  TestMessageBuilder builder;
  PackedMessageReader reader;
  word scratch [1024];
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  
  kj::heapString(&huge,0x139f);
  pcVar4 = (char *)huge.content.size_;
  if (huge.content.size_ != 0) {
    pcVar4 = huge.content.ptr;
  }
  memset(pcVar4,0x78,0x139f);
  MallocMessageBuilder::MallocMessageBuilder(&builder.super_MallocMessageBuilder,0,FIXED_SIZE);
  builder.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_0036cfc0;
  builder.desiredSegmentCount = 1;
  MessageBuilder::getRootInternal((Builder *)&pipe,(MessageBuilder *)&builder);
  reader.super_InputStreamMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)pipe.preferredReadSize;
  reader.super_PackedInputStream.super_InputStream =
       pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream;
  reader.super_PackedInputStream.inner =
       (BufferedInputStream *)pipe.super_OutputStream._vptr_OutputStream;
  PointerBuilder::initStruct
            ((StructBuilder *)scratch,(PointerBuilder *)&reader,(StructSize)0x140006);
  pcVar4 = huge.content.ptr;
  if (huge.content.size_ == 0) {
    pcVar4 = "";
  }
  value.super_StringPtr.content.size_ = huge.content.size_ + (huge.content.size_ == 0);
  reader.super_PackedInputStream.super_InputStream._vptr_InputStream =
       (_func_int **)scratch[0].content;
  reader.super_PackedInputStream.inner = (BufferedInputStream *)scratch[1].content;
  reader.super_InputStreamMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)scratch[3].content;
  value.super_StringPtr.content.ptr = pcVar4;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&reader,value);
  paVar3 = &pipe.data.field_2;
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)&PTR__TestPipe_0036cee8;
  pipe.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0036cf28;
  pipe.preferredReadSize = 0xffffffffffffffff;
  pipe.data._M_string_length = 0;
  pipe.data.field_2._M_local_buf[0] = '\0';
  pipe.readPos = 0;
  pipe.data._M_dataplus._M_p = (pointer)paVar3;
  AVar10 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&builder);
  segments_01.ptr = (ArrayPtr<const_capnp::word> *)AVar10.size_;
  segments_01.size_ = (size_t)paVar3;
  writePackedMessage((capnp *)&pipe.super_OutputStream,(OutputStream *)AVar10.ptr,segments_01);
  AVar10 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&builder);
  segments.size_ = (ArrayPtr<const_capnp::word> *)AVar10.size_;
  segments.ptr = segments.size_;
  sVar2 = computeSerializedSizeInWords((capnp *)AVar10.ptr,segments);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = (uchar *)pipe.data._M_string_length;
  scratch[1].content = computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes);
  scratch[2].content = (uint64_t)anon_var_dwarf_a914;
  scratch[3].content = 5;
  scratch[4].content._0_1_ = sVar2 == scratch[1].content;
  scratch[0].content = sVar2;
  if ((!(bool)(undefined1)scratch[4].content) && (kj::_::Debug::minSeverity < 3)) {
    AVar10 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&builder);
    segments_00.size_ = (ArrayPtr<const_capnp::word> *)AVar10.size_;
    segments_00.ptr = segments_00.size_;
    reader.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeSerializedSizeInWords((capnp *)AVar10.ptr,segments_00);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = (uchar *)pipe.data._M_string_length;
    local_2348.left.super_StringPtr.content.ptr =
         (char *)computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes_00);
    kj::_::Debug::
    log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)scratch,(unsigned_long *)&reader,
               (unsigned_long *)&local_2348);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  scratchSpace.size_ = 0x400;
  scratchSpace.ptr = scratch;
  PackedMessageReader::PackedMessageReader
            (&reader,&pipe.super_BufferedInputStream,options,scratchSpace);
  MessageReader::getRootInternal
            (&local_22a8,&reader.super_InputStreamMessageReader.super_MessageReader);
  local_2288.pointer = local_22a8.reader.pointer;
  local_2288.nestingLimit = local_22a8.reader.nestingLimit;
  local_2288._28_4_ = local_22a8.reader._28_4_;
  local_2288.segment = local_22a8.reader.segment;
  local_2288.capTable = local_22a8.reader.capTable;
  PointerReader::getStruct(&local_22d8,&local_2288,(word *)0x0);
  bVar5 = local_22d8.pointerCount == 0;
  local_2288.pointer = local_22d8.pointers;
  if (bVar5) {
    local_2288.pointer = (WirePointer *)0x0;
  }
  iVar1 = 0x7fffffff;
  if (!bVar5) {
    iVar1 = local_22d8.nestingLimit;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  if (!bVar5) {
    uVar6 = local_22d8.segment._0_4_;
    uVar7 = local_22d8.segment._4_4_;
    uVar8 = local_22d8.capTable._0_4_;
    uVar9 = local_22d8.capTable._4_4_;
  }
  local_2288.segment = (SegmentReader *)CONCAT44(uVar7,uVar6);
  local_2288.capTable = (CapTableReader *)CONCAT44(uVar9,uVar8);
  local_2288.nestingLimit = iVar1;
  AVar11 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_2288,(void *)0x0,0);
  if (huge.content.size_ + (huge.content.size_ == 0) == AVar11.size_) {
    pcVar4 = huge.content.ptr;
    if (huge.content.size_ == 0) {
      pcVar4 = "";
    }
    iVar1 = bcmp(pcVar4,AVar11.ptr,AVar11.size_);
    local_2348.op.content.ptr = " == ";
    local_2348.op.content.size_ = 5;
    local_2348.result = iVar1 == 0;
    local_2348.left.super_StringPtr.content = (StringPtr)(StringPtr)AVar11;
    local_2348.right = &huge;
    if (local_2348.result) goto LAB_001bd22a;
  }
  else {
    local_2348.result = false;
  }
  local_2348.right = &huge;
  local_2348.op.content.size_ = 5;
  local_2348.op.content.ptr = " == ";
  local_2348.left.super_StringPtr.content = (StringPtr)(StringPtr)AVar11;
  if (kj::_::Debug::minSeverity < 3) {
    local_2348.right = &huge;
    local_2348.op.content.size_ = 5;
    local_2348.op.content.ptr = " == ";
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<capnp::Text::Reader,kj::String&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x1f8,ERROR,
               "\"failed: expected \" \"reader.getRoot<TestAllTypes>().getTextField() == huge\", _kjCondition"
               ,(char (*) [71])
                "failed: expected reader.getRoot<TestAllTypes>().getTextField() == huge",&local_2348
              );
  }
LAB_001bd22a:
  PackedMessageReader::~PackedMessageReader(&reader);
  TestPipe::~TestPipe(&pipe);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  sVar2 = huge.content.size_;
  pcVar4 = huge.content.ptr;
  if (huge.content.ptr != (char *)0x0) {
    huge.content.ptr = (char *)0x0;
    huge.content.size_ = 0;
    (*(code *)**(undefined8 **)huge.content.disposer)(huge.content.disposer,pcVar4,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

TEST(Packed, RoundTripHugeStringScratchSpace) {
  kj::String huge = kj::heapString(5023);
  memset(huge.begin(), 'x', 5023);

  TestMessageBuilder builder(1);
  builder.initRoot<TestAllTypes>().setTextField(huge);

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  word scratch[1024];
  PackedMessageReader reader(pipe, ReaderOptions(), kj::ArrayPtr<word>(scratch, 1024));
  EXPECT_TRUE(reader.getRoot<TestAllTypes>().getTextField() == huge);
}